

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ev3dev::device::get_attr_string(device *this,string *name)

{
  int iVar1;
  ulong uVar2;
  ifstream *piVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  error_code eVar5;
  ifstream *is;
  string *result;
  string *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  error_category *in_stack_ffffffffffffffa0;
  error_code in_stack_ffffffffffffffa8;
  
  __lhs = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    uVar4 = __cxa_allocate_exception(0x20);
    std::make_error_code(0);
    std::system_error::system_error
              ((system_error *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
               (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::operator+(__lhs,in_stack_ffffffffffffff40);
  piVar3 = anon_unknown_20::ifstream_open(in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  uVar2 = std::ifstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::string((string *)__lhs);
    std::operator>>((istream *)piVar3,(string *)__lhs);
    return in_RDI;
  }
  uVar4 = __cxa_allocate_exception(0x20);
  eVar5 = std::make_error_code(0);
  eVar5._M_cat = eVar5._M_cat;
  iVar1 = eVar5._M_value;
  std::operator+(__lhs,in_stack_ffffffffffffff40);
  eVar5._7_1_ = in_stack_ffffffffffffff9f;
  eVar5._0_7_ = in_stack_ffffffffffffff98;
  eVar5._M_cat = in_stack_ffffffffffffffa0;
  std::system_error::system_error
            ((system_error *)eVar5._M_cat,eVar5,(string *)CONCAT44(in_stack_ffffffffffffff8c,iVar1))
  ;
  __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::string device::get_attr_string(const std::string &name) const {
    using namespace std;

    if (_path.empty())
        throw system_error(make_error_code(errc::function_not_supported), "no device connected");

    ifstream &is = ifstream_open(_path + name);
    if (is.is_open()) {
        string result;
        is >> result;
        return result;
    }

    throw system_error(make_error_code(errc::no_such_device), _path+name);
}